

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O2

void spvtools::CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
               (BasicBlock *entry,get_blocks_func *successor_func,
               function<void_(const_spvtools::val::BasicBlock_*)> *preorder,
               function<void_(const_spvtools::val::BasicBlock_*)> *postorder,
               function<bool_(const_spvtools::val::BasicBlock_*)> *terminal)

{
  _Any_data _Stack_d8;
  _Manager_type local_c8;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_90;
  _Manager_type local_80;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::function((function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
              *)&_Stack_d8,successor_func);
  std::function<void_(const_spvtools::val::BasicBlock_*)>::function
            ((function<void_(const_spvtools::val::BasicBlock_*)> *)&local_70,preorder);
  std::function<void_(const_spvtools::val::BasicBlock_*)>::function
            ((function<void_(const_spvtools::val::BasicBlock_*)> *)&local_90,postorder);
  local_a8 = (code *)0x0;
  uStack_a0 = 0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  std::function<bool_(const_spvtools::val::BasicBlock_*)>::function
            ((function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_50,terminal);
  DepthFirstTraversal(entry,(get_blocks_func *)&_Stack_d8,
                      (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_70,
                      (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_90,
                      (function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)>
                       *)&local_b8,(function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&_Stack_d8,&_Stack_d8,__destroy_functor);
  }
  return;
}

Assistant:

void CFA<BB>::DepthFirstTraversal(const BB* entry,
                                  get_blocks_func successor_func,
                                  std::function<void(cbb_ptr)> preorder,
                                  std::function<void(cbb_ptr)> postorder,
                                  std::function<bool(cbb_ptr)> terminal) {
  DepthFirstTraversal(entry, successor_func, preorder, postorder,
                      /* backedge = */ {}, terminal);
}